

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O0

boolean create_room(level *lev,xchar x,xchar y,xchar w,xchar h,xchar xal,xchar yal,xchar rtype,
                   xchar rlit)

{
  char cVar1;
  char cVar2;
  schar sVar3;
  boolean bVar4;
  int iVar5;
  int local_a4;
  char local_98;
  int local_90;
  char local_84;
  char local_7c;
  char local_78;
  char local_60;
  xchar local_5c;
  xchar local_5b;
  xchar local_5a;
  char local_59;
  int rndpos;
  xchar dy;
  xchar dx;
  xchar ly;
  xchar lx;
  xchar hy;
  xchar hx;
  xchar yborder;
  xchar xborder;
  int ylim;
  int xlim;
  char local_44;
  char local_43;
  char local_42;
  boolean vault;
  int trycnt;
  nhrect r2;
  nhrect *r1;
  int ytmp;
  int xtmp;
  int yaltmp;
  int xaltmp;
  int htmp;
  int wtmp;
  xchar yabs;
  xchar xabs;
  xchar xal_local;
  xchar h_local;
  xchar w_local;
  xchar y_local;
  level *plStack_18;
  xchar x_local;
  level *lev_local;
  
  _trycnt = (nhrect *)0x0;
  xlim = 0;
  _hy = 4;
  _dy = 3;
  if (rtype == -1) {
    rtype = '\0';
  }
  ylim._3_1_ = rtype == '\x04';
  if ((bool)ylim._3_1_) {
    _hy = 5;
    _dy = 4;
  }
  htmp._3_1_ = xal;
  wtmp._0_1_ = h;
  wtmp._1_1_ = w;
  wtmp._2_1_ = y;
  wtmp._3_1_ = x;
  plStack_18 = lev;
  if (rlit == -1) {
    sVar3 = depth(&lev->z);
    iVar5 = (int)sVar3;
    if (iVar5 < 1) {
      iVar5 = -iVar5;
    }
    iVar5 = rnd(iVar5 + 1);
    rlit = '\0';
    if (iVar5 < 0xb) {
      iVar5 = rn2(0x4d);
      rlit = iVar5 != 0;
    }
  }
  do {
    xaltmp = (int)wtmp._1_1_;
    yaltmp = (int)(xchar)wtmp;
    r1._4_4_ = (int)wtmp._3_1_;
    r1._0_4_ = (int)wtmp._2_1_;
    xtmp = (int)htmp._3_1_;
    ytmp = (int)yal;
    if (((((r1._4_4_ < 0) && ((int)r1 < 0)) && (xaltmp < 0)) && ((xtmp < 0 && (ytmp < 0)))) ||
       (ylim._3_1_ != '\0')) {
      _trycnt = rnd_rect();
      if (_trycnt == (nhrect *)0x0) {
        return '\0';
      }
      rndpos._1_1_ = _trycnt->hx;
      rndpos._0_1_ = _trycnt->hy;
      local_59 = _trycnt->lx;
      local_5a = _trycnt->ly;
      if (ylim._3_1_ == '\0') {
        iVar5 = 8;
        if (0x1c < (int)rndpos._1_1_ - (int)local_59) {
          iVar5 = 0xc;
        }
        iVar5 = rn2(iVar5);
        local_5b = (char)iVar5 + '\x02';
        iVar5 = rn2(4);
        local_5c = (char)iVar5 + '\x02';
        if (0x32 < (int)local_5b * (int)local_5c) {
          local_5c = (xchar)(0x32 / (long)(int)local_5b);
        }
      }
      else {
        local_5c = '\x01';
        local_5b = '\x01';
      }
      local_84 = (char)_hy;
      if ((local_59 < '\x01') || ('N' < rndpos._1_1_)) {
        local_78 = local_84 + '\x01';
      }
      else {
        local_78 = (char)(_hy << 1);
      }
      rndpos._3_1_ = local_78;
      if ((local_5a < '\x01') || ('\x13' < (xchar)rndpos)) {
        local_7c = (char)_dy + '\x01';
      }
      else {
        local_7c = (char)(_dy << 1);
      }
      rndpos._2_1_ = local_7c;
      if (((int)rndpos._1_1_ - (int)local_59 < local_5b + 3 + (int)local_78) ||
         ((int)(xchar)rndpos - (int)local_5a < local_5c + 3 + (int)local_7c)) {
        _trycnt = (nhrect *)0x0;
      }
      else {
        if (local_59 < '\x01') {
          local_84 = '\x03';
        }
        local_84 = local_59 + local_84;
        if (local_59 < '\x01') {
          local_90 = 3;
        }
        else {
          local_90 = (int)local_59;
        }
        iVar5 = rn2((((rndpos._1_1_ - local_90) - (int)local_5b) - (int)local_78) + 1);
        htmp._2_1_ = local_84 + (char)iVar5;
        if (local_5a < '\x01') {
          local_98 = '\x02';
        }
        else {
          local_98 = (char)_dy;
        }
        local_98 = local_5a + local_98;
        if (local_5a < '\x01') {
          local_a4 = 2;
        }
        else {
          local_a4 = (int)local_5a;
        }
        iVar5 = rn2(((((xchar)rndpos - local_a4) - (int)local_5c) - (int)rndpos._2_1_) + 1);
        htmp._1_1_ = local_98 + (char)iVar5;
        if ((((local_5a == '\0') && ('\x13' < (xchar)rndpos)) &&
            ((plStack_18->nroom == 0 || (iVar5 = rn2(plStack_18->nroom), iVar5 == 0)))) &&
           (10 < (int)htmp._1_1_ + (int)local_5c)) {
          iVar5 = rn2(3);
          htmp._1_1_ = (char)iVar5 + '\x02';
          if ((plStack_18->nroom < 4) && ('\x01' < local_5c)) {
            local_5c = local_5c + -1;
          }
        }
        bVar4 = check_room(plStack_18,(xchar *)((long)&htmp + 2),&local_5b,
                           (xchar *)((long)&htmp + 1),&local_5c,ylim._3_1_);
        if (bVar4 == '\0') {
          _trycnt = (nhrect *)0x0;
        }
        else {
          xaltmp = local_5b + 1;
          yaltmp = local_5c + 1;
          local_44 = htmp._2_1_ + -1;
          local_43 = htmp._1_1_ + -1;
          local_42 = htmp._2_1_ + (char)xaltmp;
          vault = htmp._1_1_ + (char)yaltmp;
        }
      }
    }
    else {
      local_60 = '\0';
      if ((r1._4_4_ < 0) && ((int)r1 < 0)) {
        r1._4_4_ = rnd(5);
        r1._0_4_ = rnd(5);
        local_60 = '\x01';
      }
      if ((xaltmp < 0) || (yaltmp < 0)) {
        iVar5 = rn2(0xf);
        xaltmp = iVar5 + 3;
        iVar5 = rn2(8);
        yaltmp = iVar5 + 2;
      }
      if (xtmp == -1) {
        xtmp = rnd(3);
      }
      if (ytmp == -1) {
        ytmp = rnd(3);
      }
      iVar5 = r1._4_4_ * 0x50 + -0x50;
      htmp._2_1_ = ((char)(uint)((ulong)((long)iVar5 * 0x66666667) >> 0x21) - (char)(iVar5 >> 0x1f))
                   + '\x01';
      iVar5 = (int)r1 * 0x15 + -0x15;
      htmp._1_1_ = ((char)(uint)((ulong)((long)iVar5 * 0x66666667) >> 0x21) - (char)(iVar5 >> 0x1f))
                   + '\x01';
      cVar1 = (char)xaltmp;
      if (xtmp != 1) {
        if (xtmp == 3) {
          htmp._2_1_ = htmp._2_1_ + (char)((0x10 - xaltmp) / 2);
        }
        else if (xtmp == 5) {
          htmp._2_1_ = htmp._2_1_ + ('\x10' - cVar1);
        }
      }
      cVar2 = (char)yaltmp;
      if (ytmp != 1) {
        if (ytmp == 3) {
          htmp._1_1_ = htmp._1_1_ + (char)((4 - yaltmp) / 2);
        }
        else if (ytmp == 5) {
          htmp._1_1_ = htmp._1_1_ + ('\x04' - cVar2);
        }
      }
      if (0x4e < htmp._2_1_ + xaltmp + -1) {
        htmp._2_1_ = 'M' - cVar1;
      }
      if (htmp._2_1_ < '\x02') {
        htmp._2_1_ = '\x02';
      }
      if (0x13 < htmp._1_1_ + yaltmp + -1) {
        htmp._1_1_ = '\x12' - cVar2;
      }
      if (htmp._1_1_ < '\x02') {
        htmp._1_1_ = '\x02';
      }
      local_44 = htmp._2_1_ + -1;
      local_43 = htmp._1_1_ + -1;
      local_42 = htmp._2_1_ + cVar1 + local_60;
      vault = htmp._1_1_ + cVar2 + local_60;
      _trycnt = get_rect((nhrect *)&stack0xffffffffffffffbc);
    }
    xlim = xlim + 1;
  } while (xlim < 0x65 && _trycnt == (nhrect *)0x0);
  if (_trycnt == (nhrect *)0x0) {
    lev_local._7_1_ = '\0';
  }
  else {
    split_rects(_trycnt,(nhrect *)&stack0xffffffffffffffbc);
    if (ylim._3_1_ == '\0') {
      smeq[plStack_18->nroom] = plStack_18->nroom;
      add_room(plStack_18,(int)htmp._2_1_,(int)htmp._1_1_,htmp._2_1_ + xaltmp + -1,
               htmp._1_1_ + yaltmp + -1,rlit,rtype,'\0');
    }
    else {
      plStack_18->rooms[plStack_18->nroom].lx = htmp._2_1_;
      plStack_18->rooms[plStack_18->nroom].ly = htmp._1_1_;
    }
    lev_local._7_1_ = '\x01';
  }
  return lev_local._7_1_;
}

Assistant:

boolean create_room(struct level *lev, xchar x, xchar y, xchar w, xchar h,
		    xchar xal, xchar yal, xchar rtype, xchar rlit)
{
	xchar xabs, yabs;
	int wtmp, htmp, xaltmp, yaltmp, xtmp, ytmp;
	struct nhrect *r1 = NULL, r2;
	int trycnt = 0;
	boolean vault = FALSE;
	int xlim = XLIM, ylim = YLIM;

	if (rtype == -1)	/* Is the type random ? */
	    rtype = OROOM;

	if (rtype == VAULT) {
		vault = TRUE;
		xlim++;
		ylim++;
	}

	/* on low levels the room is lit (usually) */
	/* some other rooms may require lighting */

	/* is light state random ? */
	if (rlit == -1)
	    rlit = (rnd(1+abs(depth(&lev->z))) < 11 && rn2(77)) ? TRUE : FALSE;

	/*
	 * Here we will try to create a room. If some parameters are
	 * random we are willing to make several try before we give
	 * it up.
	 */
	do {
		xchar xborder, yborder;
		wtmp = w; htmp = h;
		xtmp = x; ytmp = y;
		xaltmp = xal; yaltmp = yal;

		/* First case : a totaly random room */

		if ((xtmp < 0 && ytmp <0 && wtmp < 0 && xaltmp < 0 &&
		   yaltmp < 0) || vault) {
			xchar hx, hy, lx, ly, dx, dy;
			r1 = rnd_rect(); /* Get a random rectangle */

			if (!r1) /* No more free rectangles ! */
				return FALSE;

			hx = r1->hx;
			hy = r1->hy;
			lx = r1->lx;
			ly = r1->ly;
			if (vault)
			    dx = dy = 1;
			else {
				dx = 2 + rn2((hx-lx > 28) ? 12 : 8);
				dy = 2 + rn2(4);
				if (dx*dy > 50)
				    dy = 50/dx;
			}
			xborder = (lx > 0 && hx < COLNO -1) ? 2*xlim : xlim+1;
			yborder = (ly > 0 && hy < ROWNO -1) ? 2*ylim : ylim+1;
			if (hx-lx < dx + 3 + xborder ||
			   hy-ly < dy + 3 + yborder) {
				r1 = 0;
				continue;
			}
			xabs = lx + (lx > 0 ? xlim : 3)
			    + rn2(hx - (lx>0?lx : 3) - dx - xborder + 1);
			yabs = ly + (ly > 0 ? ylim : 2)
			    + rn2(hy - (ly>0?ly : 2) - dy - yborder + 1);
			if (ly == 0 && hy >= (ROWNO-1) &&
			    (!lev->nroom || !rn2(lev->nroom)) && (yabs+dy > ROWNO/2)) {
			    yabs = rn1(3, 2);
			    if (lev->nroom < 4 && dy>1) dy--;
		        }
			if (!check_room(lev, &xabs, &dx, &yabs, &dy, vault)) {
				r1 = 0;
				continue;
			}
			wtmp = dx+1;
			htmp = dy+1;
			r2.lx = xabs-1; r2.ly = yabs-1;
			r2.hx = xabs + wtmp;
			r2.hy = yabs + htmp;
		} else {	/* Only some parameters are random */
			int rndpos = 0;
			if (xtmp < 0 && ytmp < 0) { /* Position is RANDOM */
				xtmp = rnd(5);
				ytmp = rnd(5);
				rndpos = 1;
			}
			if (wtmp < 0 || htmp < 0) { /* Size is RANDOM */
				wtmp = rn1(15, 3);
				htmp = rn1(8, 2);
			}
			if (xaltmp == -1) /* Horizontal alignment is RANDOM */
			    xaltmp = rnd(3);
			if (yaltmp == -1) /* Vertical alignment is RANDOM */
			    yaltmp = rnd(3);

			/* Try to generate real (absolute) coordinates here! */

			xabs = (((xtmp-1) * COLNO) / 5) + 1;
			yabs = (((ytmp-1) * ROWNO) / 5) + 1;
			switch (xaltmp) {
			      case LEFT:
				break;
			      case RIGHT:
				xabs += (COLNO / 5) - wtmp;
				break;
			      case CENTER:
				xabs += ((COLNO / 5) - wtmp) / 2;
				break;
			}
			switch (yaltmp) {
			      case TOP:
				break;
			      case BOTTOM:
				yabs += (ROWNO / 5) - htmp;
				break;
			      case CENTER:
				yabs += ((ROWNO / 5) - htmp) / 2;
				break;
			}

			if (xabs + wtmp - 1 > COLNO - 2)
			    xabs = COLNO - wtmp - 3;
			if (xabs < 2)
			    xabs = 2;
			if (yabs + htmp - 1> ROWNO - 2)
			    yabs = ROWNO - htmp - 3;
			if (yabs < 2)
			    yabs = 2;

			/* Try to find a rectangle that fit our room ! */

			r2.lx = xabs-1; r2.ly = yabs-1;
			r2.hx = xabs + wtmp + rndpos;
			r2.hy = yabs + htmp + rndpos;
			r1 = get_rect(&r2);
		}
	} while (++trycnt <= 100 && !r1);
	if (!r1) {	/* creation of room failed ? */
		return FALSE;
	}
	split_rects(r1, &r2);

	if (!vault) {
		smeq[lev->nroom] = lev->nroom;
		add_room(lev, xabs, yabs, xabs+wtmp-1, yabs+htmp-1,
			 rlit, rtype, FALSE);
	} else {
		lev->rooms[lev->nroom].lx = xabs;
		lev->rooms[lev->nroom].ly = yabs;
	}
	return TRUE;
}